

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barrier_test.cpp
# Opt level: O1

void __thiscall BarrierTest_Max_Test::TestBody(BarrierTest_Max_Test *this)

{
  pointer *__ptr;
  char *message;
  AssertionResult gtest_ar;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_28;
  AssertHelper local_20;
  internal local_18 [8];
  undefined8 *local_10;
  
  local_28._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x7fffffffffffffff
  ;
  local_20.data_._0_4_ = 0;
  testing::internal::CmpHelperGT<long,int>
            (local_18,"(yamc::barrier<>::max)()","0",(long *)&local_28,(int *)&local_20);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    if (local_10 == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = (char *)*local_10;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/barrier_test.cpp"
               ,0x133,message);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if (local_28._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_28._M_head_impl + 8))();
    }
  }
  if (local_10 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_10 != local_10 + 2) {
      operator_delete((undefined8 *)*local_10);
    }
    operator_delete(local_10);
  }
  return;
}

Assistant:

TEST(BarrierTest, Max)
{
  EXPECT_GT((yamc::barrier<>::max)(), 0);
}